

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTContext.cpp
# Opt level: O0

bool __thiscall slang::ast::ASTContext::requireTimingAllowed(ASTContext *this,SourceRange range)

{
  SourceRange sourceRange;
  bool bVar1;
  bitmask<slang::ast::ASTFlags> bVar2;
  ASTContext *in_RDX;
  long in_RDI;
  undefined7 in_stack_ffffffffffffffb8;
  undefined1 in_stack_ffffffffffffffbf;
  bool bVar3;
  bitmask<slang::ast::ASTFlags> *in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffd0;
  DiagCode code;
  undefined1 local_1;
  
  bVar2 = ast::operator|(CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8),
                         in_RDI + AssignmentDisallowed);
  code = SUB84((ulong)in_RDI >> 0x20,0);
  bVar1 = bitmask<slang::ast::ASTFlags>::has
                    (in_stack_ffffffffffffffc0,
                     (bitmask<slang::ast::ASTFlags> *)
                     CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8));
  bVar3 = true;
  if (!bVar1) {
    bVar3 = inAlwaysCombLatch((ASTContext *)CONCAT17(1,in_stack_ffffffffffffffb8));
  }
  if (bVar3 != false) {
    sourceRange.startLoc._4_4_ = 0x4d0008;
    sourceRange.startLoc._0_4_ = in_stack_ffffffffffffffd0;
    sourceRange.endLoc = (SourceLocation)bVar2.m_bits;
    addDiag(in_RDX,code,sourceRange);
  }
  local_1 = bVar3 == false;
  return local_1;
}

Assistant:

bool ASTContext::requireTimingAllowed(SourceRange range) const {
    if (flags.has(ASTFlags::Function | ASTFlags::Final) || inAlwaysCombLatch()) {
        addDiag(diag::TimingInFuncNotAllowed, range);
        return false;
    }
    return true;
}